

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O3

int VP8InitFrame(VP8Decoder *dec,VP8Io *io)

{
  VP8FInfo *pVVar1;
  size_t __n;
  byte bVar2;
  int iVar3;
  WebPWorkerInterface *pWVar4;
  uint8_t *puVar5;
  VP8TopSamples *pVVar6;
  int iVar7;
  long lVar8;
  VP8FInfo *pVVar9;
  VP8MBData *pVVar10;
  long lVar11;
  int iVar12;
  uint8_t *puVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong nmemb;
  
  dec->cache_id_ = 0;
  if (dec->mt_method_ < 1) {
    dec->num_caches_ = 1;
    uVar14 = 1;
  }
  else {
    pWVar4 = WebPGetWorkerInterface();
    iVar3 = (*pWVar4->Reset)(&dec->worker_);
    if (iVar3 == 0) {
      iVar3 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"thread initialization failed.");
      if (iVar3 == 0) {
        return 0;
      }
      uVar14 = dec->num_caches_;
    }
    else {
      (dec->worker_).data1 = dec;
      (dec->worker_).data2 = &(dec->thread_ctx_).io_;
      (dec->worker_).hook = FinishRow;
      uVar14 = 0 < dec->filter_type_ | 2;
      dec->num_caches_ = uVar14;
    }
  }
  iVar3 = dec->mb_w_;
  lVar16 = (long)iVar3;
  iVar12 = dec->filter_type_;
  iVar7 = dec->mt_method_;
  if ((long)iVar12 < 1) {
    lVar11 = 0;
  }
  else {
    lVar11 = (long)(iVar3 << (0 < iVar7)) << 2;
  }
  __n = lVar16 * 2 + 2;
  lVar17 = (long)(iVar3 << (iVar7 == 2)) * 800;
  lVar15 = (long)((int)(((uint)""[iVar12] + uVar14 * 0x10) * 3) / 2) * lVar16 * 0x20;
  if (dec->alpha_data_ == (uint8_t *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (ulong)(dec->pic_hdr_).height_ * (ulong)(dec->pic_hdr_).width_;
  }
  nmemb = lVar8 + lVar16 * 0x24 + __n + lVar11 + lVar17 + lVar15 + 0x35f;
  puVar5 = (uint8_t *)dec->mem_;
  if (dec->mem_size_ < nmemb) {
    WebPSafeFree(puVar5);
    dec->mem_size_ = 0;
    puVar5 = (uint8_t *)WebPSafeMalloc(nmemb,1);
    dec->mem_ = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      iVar3 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"no memory during frame initialization.");
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_00132fa4;
    }
    dec->mem_size_ = nmemb;
    iVar12 = dec->filter_type_;
    iVar7 = dec->mt_method_;
  }
  dec->intra_t_ = puVar5;
  pVVar6 = (VP8TopSamples *)(puVar5 + lVar16 * 4);
  dec->yuv_t_ = pVVar6;
  dec->mb_info_ = (VP8MB *)(pVVar6[lVar16].y + 2);
  pVVar1 = (VP8FInfo *)(pVVar6[lVar16].y + __n);
  pVVar9 = pVVar1;
  if (lVar11 == 0) {
    pVVar9 = (VP8FInfo *)0x0;
  }
  dec->f_info_ = pVVar9;
  (dec->thread_ctx_).id_ = 0;
  (dec->thread_ctx_).f_info_ = pVVar9;
  if (iVar12 < 1) {
LAB_00132e89:
    puVar5 = (uint8_t *)((ulong)(&pVVar1[7].hev_thresh_ + lVar11) & 0xffffffffffffffe0);
    dec->yuv_b_ = puVar5;
    dec->mb_data_ = (VP8MBData *)(puVar5 + 0x340);
    lVar11 = 0;
    if (iVar7 == 2) {
      lVar11 = lVar16;
    }
    pVVar10 = (VP8MBData *)(puVar5 + lVar11 * 800 + 0x340);
  }
  else {
    if (0 < iVar7) {
      (dec->thread_ctx_).f_info_ = pVVar9 + lVar16;
      goto LAB_00132e89;
    }
    puVar5 = (uint8_t *)((ulong)(&pVVar1[7].hev_thresh_ + lVar11) & 0xffffffffffffffe0);
    dec->yuv_b_ = puVar5;
    pVVar10 = (VP8MBData *)(puVar5 + 0x340);
    dec->mb_data_ = pVVar10;
  }
  (dec->thread_ctx_).mb_data_ = pVVar10;
  iVar7 = (int)(lVar16 * 0x10);
  dec->cache_y_stride_ = iVar7;
  iVar3 = iVar3 * 8;
  dec->cache_uv_stride_ = iVar3;
  bVar2 = ""[iVar12];
  puVar13 = puVar5 + (ulong)bVar2 * lVar16 * 0x10 + lVar17 + 0x340;
  dec->cache_y_ = puVar13;
  lVar11 = (long)(int)((uint)(bVar2 >> 1) * iVar3);
  dec->cache_u_ = puVar13 + lVar11 + (int)(uVar14 * 0x10 * iVar7);
  dec->cache_v_ =
       puVar13 + lVar11 + (int)(uVar14 * 0x10 * iVar7) + (int)(uVar14 * iVar3 * 8) + lVar11;
  dec->cache_id_ = 0;
  puVar5 = puVar5 + lVar15 + lVar17 + 0x340;
  if (lVar8 == 0) {
    puVar5 = (uint8_t *)0x0;
  }
  dec->alpha_plane_ = puVar5;
  memset(pVVar6 + lVar16,0,__n);
  VP8InitScanline(dec);
  memset(dec->intra_t_,0,lVar16 * 4);
LAB_00132fa4:
  io->mb_y = 0;
  puVar5 = dec->cache_u_;
  io->y = dec->cache_y_;
  io->u = puVar5;
  io->v = dec->cache_v_;
  iVar3 = dec->cache_uv_stride_;
  io->y_stride = dec->cache_y_stride_;
  io->uv_stride = iVar3;
  io->a = (uint8_t *)0x0;
  VP8DspInit();
  return 1;
}

Assistant:

int VP8InitFrame(VP8Decoder* const dec, VP8Io* const io) {
  if (!InitThreadContext(dec)) return 0;  // call first. Sets dec->num_caches_.
  if (!AllocateMemory(dec)) return 0;
  InitIo(dec, io);
  VP8DspInit();  // Init critical function pointers and look-up tables.
  return 1;
}